

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [24];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [24];
  long *in_RSI;
  double dVar37;
  float fVar38;
  float fVar39;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 two;
  __m256 one;
  __m128 two_1;
  __m128 one_3;
  __m256 one_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 one_4;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 local_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  int local_19b8;
  undefined8 local_19a8;
  undefined8 local_19a0;
  undefined8 local_1998;
  undefined4 local_1990;
  long local_1988;
  undefined4 local_1980;
  undefined4 local_197c;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined8 local_1968;
  undefined1 (*local_1960) [32];
  int local_1954;
  int local_1950;
  int local_194c;
  int local_1948;
  int local_1944;
  int local_1940;
  int local_193c;
  long *local_1930;
  undefined1 local_191d;
  int local_191c;
  undefined8 *local_1910;
  undefined8 *local_1908;
  undefined8 *local_18f8;
  undefined1 (*local_18e8) [32];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined1 (*local_1850) [32];
  undefined1 (*local_1848) [32];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined1 (*local_1800) [32];
  long local_17f8;
  undefined4 local_17ec;
  long local_17e8;
  undefined1 (*local_17e0) [32];
  undefined4 local_17d4;
  int local_17d0;
  int local_17cc;
  undefined8 *local_17c8;
  undefined4 local_17bc;
  long local_17b8;
  undefined8 *local_1798;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined1 local_1740 [32];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined1 local_1700 [8];
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  undefined4 uStack_1664;
  undefined4 local_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  ulong uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  undefined4 local_15a0;
  undefined4 local_159c;
  undefined4 local_1598;
  undefined4 local_1594;
  undefined4 local_1590;
  undefined4 local_158c;
  undefined4 local_1588;
  undefined4 local_1584;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  undefined4 local_1560;
  undefined4 local_155c;
  undefined4 local_1558;
  undefined4 local_1554;
  undefined4 local_1550;
  undefined4 local_154c;
  undefined4 local_1548;
  undefined4 local_1544;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined1 local_14e0 [8];
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [32];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [8];
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  undefined4 uStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined4 local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined4 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined4 local_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined4 local_714;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined4 local_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined4 local_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  ulong uStack_658;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_193c = *(int *)((long)in_RSI + 0x2c);
  local_1940 = (int)in_RSI[6];
  local_1944 = *(int *)((long)in_RSI + 0x34);
  local_1948 = (int)in_RSI[7];
  local_194c = (int)in_RSI[3];
  local_1950 = local_193c * local_1940 * local_1944 * local_194c;
  local_1930 = in_RSI;
  for (local_1954 = 0; local_1954 < local_1948; local_1954 = local_1954 + 1) {
    local_1910 = &local_19a8;
    local_17cc = *(int *)((long)local_1930 + 0x2c);
    local_17d0 = (int)local_1930[6];
    local_17d4 = *(undefined4 *)((long)local_1930 + 0x34);
    local_17e0 = (undefined1 (*) [32])
                 (*local_1930 + local_1930[8] * (long)local_1954 * local_1930[2]);
    local_17e8 = local_1930[2];
    local_17ec = (undefined4)local_1930[3];
    local_17f8 = local_1930[4];
    local_17c8 = &local_19a8;
    local_17b8 = (long)local_17cc * (long)local_17d0 * local_17e8;
    local_1908 = &local_19a8;
    local_18f8 = &local_19a8;
    local_17bc = 0x10;
    local_191c = local_1954;
    local_191d = 1;
    local_19a8 = 0;
    local_1998 = 0;
    local_1990 = 0;
    local_1980 = 0;
    local_197c = 0;
    local_1978 = 0;
    local_1974 = 0;
    local_1970 = 0;
    local_1968 = 0;
    local_19a0 = 0;
    local_1960 = local_17e0;
    for (local_19b8 = 0; local_19b8 + 7 < local_1950; local_19b8 = local_19b8 + 8) {
      local_18e8 = local_1960;
      auVar15 = *(undefined1 (*) [24])*local_1960;
      uStack_1888 = *(undefined8 *)(*local_1960 + 0x18);
      local_19e0 = auVar15._0_8_;
      local_18a0 = local_19e0;
      uStack_19d8 = auVar15._8_8_;
      uStack_1898 = uStack_19d8;
      uStack_19d0 = auVar15._16_8_;
      uStack_1890 = uStack_19d0;
      local_1764 = 0x3f800000;
      local_15a0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_15c0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_15b0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_18c0 = local_15c0._0_8_;
      uStack_18b8 = local_15c0._8_8_;
      uStack_18b0 = auStack_15b0._0_8_;
      uStack_18a8 = auStack_15b0._8_8_;
      local_1768 = 0x40000000;
      local_1560 = 0x40000000;
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      local_1580 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      auStack_1570 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      local_18e0 = local_1580._0_8_;
      uStack_18d8 = local_1580._8_8_;
      uStack_18d0 = auStack_1570._0_8_;
      uStack_18c8 = auStack_1570._8_8_;
      uVar7 = local_19e0;
      uVar8 = uStack_19d8;
      uVar9 = uStack_19d0;
      local_16c0._0_4_ = auVar15._0_4_;
      local_16c0._4_4_ = auVar15._4_4_;
      uStack_16b8._0_4_ = auVar15._8_4_;
      uStack_16b8._4_4_ = auVar15._12_4_;
      uStack_16b0._0_4_ = auVar15._16_4_;
      uStack_16b0._4_4_ = auVar15._20_4_;
      uStack_16a8._0_4_ = (float)uStack_1888;
      uStack_16a8._4_4_ = (undefined4)((ulong)uStack_1888 >> 0x20);
      uStack_1664 = uStack_16a8._4_4_;
      local_16e0._0_4_ = local_1580._0_4_;
      local_16e0._4_4_ = local_1580._4_4_;
      uStack_16d8._0_4_ = local_1580._8_4_;
      uStack_16d8._4_4_ = local_1580._12_4_;
      uStack_16d0._0_4_ = auStack_1570._0_4_;
      uStack_16d0._4_4_ = auStack_1570._4_4_;
      uStack_16c8._0_4_ = auStack_1570._8_4_;
      local_1680 = (float)local_16c0 * (float)local_16e0;
      fStack_167c = local_16c0._4_4_ * local_16e0._4_4_;
      fStack_1678 = (float)uStack_16b8 * (float)uStack_16d8;
      fStack_1674 = uStack_16b8._4_4_ * uStack_16d8._4_4_;
      fStack_1670 = (float)uStack_16b0 * (float)uStack_16d0;
      fStack_166c = uStack_16b0._4_4_ * uStack_16d0._4_4_;
      fStack_1668 = (float)uStack_16a8 * (float)uStack_16c8;
      local_1644 = 0x3f800000;
      local_15e0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1600 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_15f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_16a0 = local_1600._0_8_;
      uStack_1698 = local_1600._8_8_;
      uStack_1690 = auStack_15f0._0_8_;
      uStack_1688 = auStack_15f0._8_8_;
      local_1520._16_8_ = auStack_15f0._0_8_;
      local_1520._0_16_ = local_1600;
      local_1520._24_8_ = auStack_15f0._8_8_;
      local_12c0 = ZEXT832(0) << 0x20;
      local_1620 = 0;
      local_12a0._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1618 = local_12a0._8_8_;
      uStack_1610 = 0;
      uStack_1608 = 0;
      local_1640 = CONCAT44(fStack_167c,local_1680);
      uStack_1638 = CONCAT44(fStack_1674,fStack_1678);
      uStack_1630 = CONCAT44(fStack_166c,fStack_1670);
      uStack_1628 = CONCAT44(uStack_16a8._4_4_,fStack_1668);
      auVar4._8_8_ = uStack_1638;
      auVar4._0_8_ = local_1640;
      auVar4._16_8_ = uStack_1630;
      auVar4._24_8_ = uStack_1628;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_12a0._8_8_) << 0x40,auVar4);
      local_1460 = 0x3f8000003f800000;
      uStack_1458 = 0x3f8000003f800000;
      uStack_1450 = 0x3f8000003f800000;
      uStack_1448 = 0x3f8000003f800000;
      local_13e0._0_8_ = auVar6._0_8_;
      local_1260 = local_13e0._0_8_;
      local_13e0._8_8_ = auVar6._8_8_;
      uStack_1258 = local_13e0._8_8_;
      local_13e0._16_8_ = auVar6._16_8_;
      uStack_1250 = local_13e0._16_8_;
      local_13e0._24_8_ = auVar6._24_8_;
      uStack_1248 = local_13e0._24_8_;
      local_1280 = 0x42b0c0a542b0c0a5;
      uStack_1278 = 0x42b0c0a542b0c0a5;
      uStack_1270 = 0x42b0c0a542b0c0a5;
      uStack_1268 = 0x42b0c0a542b0c0a5;
      auVar16._8_8_ = 0x42b0c0a542b0c0a5;
      auVar16._0_8_ = 0x42b0c0a542b0c0a5;
      auVar16._16_8_ = 0x42b0c0a542b0c0a5;
      auVar16._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar16);
      local_13e0._0_8_ = auVar6._0_8_;
      local_1220 = local_13e0._0_8_;
      local_13e0._8_8_ = auVar6._8_8_;
      uStack_1218 = local_13e0._8_8_;
      local_13e0._16_8_ = auVar6._16_8_;
      uStack_1210 = local_13e0._16_8_;
      local_13e0._24_8_ = auVar6._24_8_;
      uStack_1208 = local_13e0._24_8_;
      local_1240 = 0xc2b0c0a5c2b0c0a5;
      uStack_1238 = 0xc2b0c0a5c2b0c0a5;
      uStack_1230 = 0xc2b0c0a5c2b0c0a5;
      uStack_1228 = 0xc2b0c0a5c2b0c0a5;
      auVar17._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar17);
      local_13e0._0_8_ = auVar4._0_8_;
      local_c80 = local_13e0._0_8_;
      local_13e0._8_8_ = auVar4._8_8_;
      uStack_c78 = local_13e0._8_8_;
      local_13e0._16_8_ = auVar4._16_8_;
      uStack_c70 = local_13e0._16_8_;
      local_13e0._24_8_ = auVar4._24_8_;
      uStack_c68 = local_13e0._24_8_;
      local_ca0 = 0x3fb8aa3b3fb8aa3b;
      uStack_c98 = 0x3fb8aa3b3fb8aa3b;
      uStack_c90 = 0x3fb8aa3b3fb8aa3b;
      uStack_c88 = 0x3fb8aa3b3fb8aa3b;
      local_1120 = 0x3f0000003f000000;
      uStack_1118 = 0x3f0000003f000000;
      uStack_1110 = 0x3f0000003f000000;
      uStack_1108 = 0x3f0000003f000000;
      uVar10 = local_13e0._0_8_;
      uVar11 = local_13e0._8_8_;
      uVar12 = local_13e0._16_8_;
      uVar13 = local_13e0._24_8_;
      local_c60 = 0x3fb8aa3b3fb8aa3b;
      uStack_c58 = 0x3fb8aa3b3fb8aa3b;
      uStack_c50 = 0x3fb8aa3b3fb8aa3b;
      uStack_c48 = 0x3fb8aa3b3fb8aa3b;
      local_c40._0_4_ = auVar4._0_4_;
      local_c40._4_4_ = auVar4._4_4_;
      uStack_c38._0_4_ = auVar4._8_4_;
      uStack_c38._4_4_ = auVar4._12_4_;
      uStack_c30._0_4_ = auVar4._16_4_;
      uStack_c30._4_4_ = auVar4._20_4_;
      uStack_c28._0_4_ = auVar4._24_4_;
      uStack_be4 = 0x3fb8aa3b;
      local_c00 = (float)local_c40 * 1.442695;
      fStack_bfc = local_c40._4_4_ * 1.442695;
      fStack_bf8 = (float)uStack_c38 * 1.442695;
      fStack_bf4 = uStack_c38._4_4_ * 1.442695;
      fStack_bf0 = (float)uStack_c30 * 1.442695;
      fStack_bec = uStack_c30._4_4_ * 1.442695;
      fStack_be8 = (float)uStack_c28 * 1.442695;
      local_c20 = 0x3f0000003f000000;
      uStack_c18 = 0x3f0000003f000000;
      uStack_c10 = 0x3f0000003f000000;
      uStack_c08 = 0x3f0000003f000000;
      local_1420._4_4_ = fStack_bfc + 0.5;
      local_1420._0_4_ = local_c00 + 0.5;
      uStack_1418._0_4_ = fStack_bf8 + 0.5;
      uStack_1418._4_4_ = fStack_bf4 + 0.5;
      uStack_1410._0_4_ = fStack_bf0 + 0.5;
      uStack_1410._4_4_ = fStack_bec + 0.5;
      uStack_1408._0_4_ = fStack_be8 + 0.5;
      uStack_1408._4_4_ = 0x3ff8aa3b;
      auVar5 = vroundps_avx(_local_1420,1);
      auVar6 = vcmpps_avx(_local_1420,auVar5,1);
      local_1480._0_8_ = auVar6._0_8_;
      local_bc0 = local_1480._0_8_;
      local_1480._8_8_ = auVar6._8_8_;
      uStack_bb8 = local_1480._8_8_;
      local_1480._16_8_ = auVar6._16_8_;
      uStack_bb0 = local_1480._16_8_;
      local_1480._24_8_ = auVar6._24_8_;
      uStack_ba8 = local_1480._24_8_;
      local_be0 = 0x3f8000003f800000;
      uStack_bd8 = 0x3f8000003f800000;
      uStack_bd0 = 0x3f8000003f800000;
      uStack_bc8 = 0x3f8000003f800000;
      auVar18._8_8_ = 0x3f8000003f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._16_8_ = 0x3f8000003f800000;
      auVar18._24_8_ = 0x3f8000003f800000;
      local_1480 = vandps_avx(auVar6,auVar18);
      local_1400 = auVar5._0_8_;
      local_13a0 = local_1400;
      uStack_13f8 = auVar5._8_8_;
      uStack_1398 = uStack_13f8;
      uStack_13f0 = auVar5._16_8_;
      uStack_1390 = uStack_13f0;
      uStack_13e8 = auVar5._24_8_;
      uStack_1388 = uStack_13e8;
      local_13c0 = local_1480._0_8_;
      uStack_13b8 = local_1480._8_8_;
      uStack_13b0 = local_1480._16_8_;
      uStack_13a8 = local_1480._24_8_;
      _local_1420 = vsubps_avx(auVar5,local_1480);
      local_a80 = local_1420;
      uStack_a78 = uStack_1418;
      uStack_a70 = uStack_1410;
      uStack_a68 = uStack_1408;
      local_ac0 = local_13e0._0_8_;
      uStack_ab8 = local_13e0._8_8_;
      uStack_ab0 = local_13e0._16_8_;
      uStack_aa8 = local_13e0._24_8_;
      local_aa0 = 0x3f3180003f318000;
      uStack_a98 = 0x3f3180003f318000;
      uStack_a90 = 0x3f3180003f318000;
      uStack_a88 = 0x3f3180003f318000;
      local_a40 = local_13e0._0_8_;
      uStack_a38 = local_13e0._8_8_;
      uStack_a30 = local_13e0._16_8_;
      uStack_a28 = local_13e0._24_8_;
      local_a20 = 0x3f3180003f318000;
      uStack_a18 = 0x3f3180003f318000;
      uStack_a10 = 0x3f3180003f318000;
      uStack_a08 = 0x3f3180003f318000;
      local_a00._0_4_ = local_1420._0_4_;
      local_a00._4_4_ = local_1420._4_4_;
      uStack_9f8._0_4_ = local_1420._8_4_;
      uStack_9f8._4_4_ = local_1420._12_4_;
      uStack_9f0._0_4_ = local_1420._16_4_;
      uStack_9f0._4_4_ = local_1420._20_4_;
      uStack_9e8._0_4_ = local_1420._24_4_;
      uStack_9e8._4_4_ = local_1420._28_4_;
      fStack_a44 = uStack_9e8._4_4_;
      local_a60 = (float)local_a00 * 0.6933594;
      fStack_a5c = local_a00._4_4_ * 0.6933594;
      fStack_a58 = (float)uStack_9f8 * 0.6933594;
      fStack_a54 = uStack_9f8._4_4_ * 0.6933594;
      fStack_a50 = (float)uStack_9f0 * 0.6933594;
      fStack_a4c = uStack_9f0._4_4_ * 0.6933594;
      fStack_a48 = (float)uStack_9e8 * 0.6933594;
      auVar20._4_4_ = fStack_a5c;
      auVar20._0_4_ = local_a60;
      auVar20._8_4_ = fStack_a58;
      auVar20._12_4_ = fStack_a54;
      auVar20._16_4_ = fStack_a50;
      auVar20._20_4_ = fStack_a4c;
      auVar20._24_4_ = fStack_a48;
      auVar20._28_4_ = uStack_9e8._4_4_;
      auVar6 = vsubps_avx(auVar4,auVar20);
      local_b60 = local_1420;
      uStack_b58 = uStack_1418;
      uStack_b50 = uStack_1410;
      uStack_b48 = uStack_1408;
      local_13e0._0_8_ = auVar6._0_8_;
      local_ba0 = local_13e0._0_8_;
      local_13e0._8_8_ = auVar6._8_8_;
      uStack_b98 = local_13e0._8_8_;
      local_13e0._16_8_ = auVar6._16_8_;
      uStack_b90 = local_13e0._16_8_;
      local_13e0._24_8_ = auVar6._24_8_;
      uStack_b88 = local_13e0._24_8_;
      local_b80 = 0xb95e8083b95e8083;
      uStack_b78 = 0xb95e8083b95e8083;
      uStack_b70 = 0xb95e8083b95e8083;
      uStack_b68 = 0xb95e8083b95e8083;
      local_b20 = local_13e0._0_8_;
      uStack_b18 = local_13e0._8_8_;
      uStack_b10 = local_13e0._16_8_;
      uStack_b08 = local_13e0._24_8_;
      local_ae0 = local_1420;
      uStack_ad8 = uStack_1418;
      uStack_ad0 = uStack_1410;
      uStack_ac8 = uStack_1408;
      local_b00 = 0xb95e8083b95e8083;
      uStack_af8 = 0xb95e8083b95e8083;
      uStack_af0 = 0xb95e8083b95e8083;
      uStack_ae8 = 0xb95e8083b95e8083;
      fStack_b24 = uStack_9e8._4_4_;
      local_b40 = (float)local_a00 * -0.00021219444;
      fStack_b3c = local_a00._4_4_ * -0.00021219444;
      fStack_b38 = (float)uStack_9f8 * -0.00021219444;
      fStack_b34 = uStack_9f8._4_4_ * -0.00021219444;
      fStack_b30 = (float)uStack_9f0 * -0.00021219444;
      fStack_b2c = uStack_9f0._4_4_ * -0.00021219444;
      fStack_b28 = (float)uStack_9e8 * -0.00021219444;
      auVar19._4_4_ = fStack_b3c;
      auVar19._0_4_ = local_b40;
      auVar19._8_4_ = fStack_b38;
      auVar19._12_4_ = fStack_b34;
      auVar19._16_4_ = fStack_b30;
      auVar19._20_4_ = fStack_b2c;
      auVar19._24_4_ = fStack_b28;
      auVar19._28_4_ = uStack_9e8._4_4_;
      local_13e0 = vsubps_avx(auVar6,auVar19);
      local_1340 = local_13e0._0_8_;
      uStack_1338 = local_13e0._8_8_;
      uStack_1330 = local_13e0._16_8_;
      uStack_1328 = local_13e0._24_8_;
      local_1320._0_4_ = local_13e0._0_4_;
      local_1320._4_4_ = local_13e0._4_4_;
      uStack_1318._0_4_ = local_13e0._8_4_;
      uStack_1318._4_4_ = local_13e0._12_4_;
      uStack_1310._0_4_ = local_13e0._16_4_;
      uStack_1310._4_4_ = local_13e0._20_4_;
      uStack_1308._0_4_ = local_13e0._24_4_;
      uStack_1308._4_4_ = local_13e0._28_4_;
      local_1400 = CONCAT44(local_1320._4_4_ * local_1320._4_4_,
                            (float)local_1320 * (float)local_1320);
      uStack_13f8._0_4_ = (float)uStack_1318 * (float)uStack_1318;
      uStack_13f8._4_4_ = uStack_1318._4_4_ * uStack_1318._4_4_;
      uStack_13f0._0_4_ = (float)uStack_1310 * (float)uStack_1310;
      uStack_13f0._4_4_ = uStack_1310._4_4_ * uStack_1310._4_4_;
      auVar36 = _local_1400;
      uStack_13e8._0_4_ = (float)uStack_1308 * (float)uStack_1308;
      uStack_13e8._4_4_ = uStack_1308._4_4_;
      auVar4 = _local_1400;
      local_d60 = 0x3950696739506967;
      uStack_d58 = 0x3950696739506967;
      uStack_d50 = 0x3950696739506967;
      uStack_d48 = 0x3950696739506967;
      local_d80 = local_13e0._0_8_;
      uStack_d78 = local_13e0._8_8_;
      uStack_d70 = local_13e0._16_8_;
      uStack_d68 = local_13e0._24_8_;
      local_da0 = 0x3ab743ce3ab743ce;
      uStack_d98 = 0x3ab743ce3ab743ce;
      uStack_d90 = 0x3ab743ce3ab743ce;
      uStack_d88 = 0x3ab743ce3ab743ce;
      local_d40 = local_13e0._0_8_;
      uStack_d38 = local_13e0._8_8_;
      uStack_d30 = local_13e0._16_8_;
      uStack_d28 = local_13e0._24_8_;
      fStack_cc4 = uStack_1308._4_4_;
      local_ce0 = (float)local_1320 * 0.00019875691;
      fStack_cdc = local_1320._4_4_ * 0.00019875691;
      fStack_cd8 = (float)uStack_1318 * 0.00019875691;
      fStack_cd4 = uStack_1318._4_4_ * 0.00019875691;
      fStack_cd0 = (float)uStack_1310 * 0.00019875691;
      fStack_ccc = uStack_1310._4_4_ * 0.00019875691;
      fStack_cc8 = (float)uStack_1308 * 0.00019875691;
      local_d00 = 0x3ab743ce3ab743ce;
      uStack_cf8 = 0x3ab743ce3ab743ce;
      uStack_cf0 = 0x3ab743ce3ab743ce;
      uStack_ce8 = 0x3ab743ce3ab743ce;
      local_e40 = CONCAT44(fStack_cdc + 0.0013981999,local_ce0 + 0.0013981999);
      uStack_e38 = CONCAT44(fStack_cd4 + 0.0013981999,fStack_cd8 + 0.0013981999);
      uStack_e30 = CONCAT44(fStack_ccc + 0.0013981999,fStack_cd0 + 0.0013981999);
      uStack_e28 = CONCAT44(uStack_1308._4_4_ + 0.0013981999,fStack_cc8 + 0.0013981999);
      local_e60 = local_13e0._0_8_;
      uStack_e58 = local_13e0._8_8_;
      uStack_e50 = local_13e0._16_8_;
      uStack_e48 = local_13e0._24_8_;
      local_e80 = 0x3c0889083c088908;
      uStack_e78 = 0x3c0889083c088908;
      uStack_e70 = 0x3c0889083c088908;
      uStack_e68 = 0x3c0889083c088908;
      local_e20 = local_13e0._0_8_;
      uStack_e18 = local_13e0._8_8_;
      uStack_e10 = local_13e0._16_8_;
      uStack_e08 = local_13e0._24_8_;
      fStack_da4 = uStack_1308._4_4_;
      local_dc0 = (local_ce0 + 0.0013981999) * (float)local_1320;
      fStack_dbc = (fStack_cdc + 0.0013981999) * local_1320._4_4_;
      fStack_db8 = (fStack_cd8 + 0.0013981999) * (float)uStack_1318;
      fStack_db4 = (fStack_cd4 + 0.0013981999) * uStack_1318._4_4_;
      fStack_db0 = (fStack_cd0 + 0.0013981999) * (float)uStack_1310;
      fStack_dac = (fStack_ccc + 0.0013981999) * uStack_1310._4_4_;
      fStack_da8 = (fStack_cc8 + 0.0013981999) * (float)uStack_1308;
      local_de0 = 0x3c0889083c088908;
      uStack_dd8 = 0x3c0889083c088908;
      uStack_dd0 = 0x3c0889083c088908;
      uStack_dc8 = 0x3c0889083c088908;
      local_f20 = CONCAT44(fStack_dbc + 0.008333452,local_dc0 + 0.008333452);
      uStack_f18 = CONCAT44(fStack_db4 + 0.008333452,fStack_db8 + 0.008333452);
      uStack_f10 = CONCAT44(fStack_dac + 0.008333452,fStack_db0 + 0.008333452);
      uStack_f08 = CONCAT44(uStack_1308._4_4_ + 0.008333452,fStack_da8 + 0.008333452);
      local_f40 = local_13e0._0_8_;
      uStack_f38 = local_13e0._8_8_;
      uStack_f30 = local_13e0._16_8_;
      uStack_f28 = local_13e0._24_8_;
      local_f60 = 0x3d2aa9c13d2aa9c1;
      uStack_f58 = 0x3d2aa9c13d2aa9c1;
      uStack_f50 = 0x3d2aa9c13d2aa9c1;
      uStack_f48 = 0x3d2aa9c13d2aa9c1;
      local_f00 = local_13e0._0_8_;
      uStack_ef8 = local_13e0._8_8_;
      uStack_ef0 = local_13e0._16_8_;
      uStack_ee8 = local_13e0._24_8_;
      fStack_e84 = uStack_1308._4_4_;
      local_ea0 = (local_dc0 + 0.008333452) * (float)local_1320;
      fStack_e9c = (fStack_dbc + 0.008333452) * local_1320._4_4_;
      fStack_e98 = (fStack_db8 + 0.008333452) * (float)uStack_1318;
      fStack_e94 = (fStack_db4 + 0.008333452) * uStack_1318._4_4_;
      fStack_e90 = (fStack_db0 + 0.008333452) * (float)uStack_1310;
      fStack_e8c = (fStack_dac + 0.008333452) * uStack_1310._4_4_;
      fStack_e88 = (fStack_da8 + 0.008333452) * (float)uStack_1308;
      local_ec0 = 0x3d2aa9c13d2aa9c1;
      uStack_eb8 = 0x3d2aa9c13d2aa9c1;
      uStack_eb0 = 0x3d2aa9c13d2aa9c1;
      uStack_ea8 = 0x3d2aa9c13d2aa9c1;
      local_1000 = CONCAT44(fStack_e9c + 0.041665796,local_ea0 + 0.041665796);
      uStack_ff8 = CONCAT44(fStack_e94 + 0.041665796,fStack_e98 + 0.041665796);
      uStack_ff0 = CONCAT44(fStack_e8c + 0.041665796,fStack_e90 + 0.041665796);
      uStack_fe8 = CONCAT44(uStack_1308._4_4_ + 0.041665796,fStack_e88 + 0.041665796);
      local_1020 = local_13e0._0_8_;
      uStack_1018 = local_13e0._8_8_;
      uStack_1010 = local_13e0._16_8_;
      uStack_1008 = local_13e0._24_8_;
      local_1040 = 0x3e2aaaaa3e2aaaaa;
      uStack_1038 = 0x3e2aaaaa3e2aaaaa;
      uStack_1030 = 0x3e2aaaaa3e2aaaaa;
      uStack_1028 = 0x3e2aaaaa3e2aaaaa;
      local_fe0 = local_13e0._0_8_;
      uStack_fd8 = local_13e0._8_8_;
      uStack_fd0 = local_13e0._16_8_;
      uStack_fc8 = local_13e0._24_8_;
      fStack_f64 = uStack_1308._4_4_;
      local_f80 = (local_ea0 + 0.041665796) * (float)local_1320;
      fStack_f7c = (fStack_e9c + 0.041665796) * local_1320._4_4_;
      fStack_f78 = (fStack_e98 + 0.041665796) * (float)uStack_1318;
      fStack_f74 = (fStack_e94 + 0.041665796) * uStack_1318._4_4_;
      fStack_f70 = (fStack_e90 + 0.041665796) * (float)uStack_1310;
      fStack_f6c = (fStack_e8c + 0.041665796) * uStack_1310._4_4_;
      fStack_f68 = (fStack_e88 + 0.041665796) * (float)uStack_1308;
      local_fa0 = 0x3e2aaaaa3e2aaaaa;
      uStack_f98 = 0x3e2aaaaa3e2aaaaa;
      uStack_f90 = 0x3e2aaaaa3e2aaaaa;
      uStack_f88 = 0x3e2aaaaa3e2aaaaa;
      local_10e0 = CONCAT44(fStack_f7c + 0.16666666,local_f80 + 0.16666666);
      uStack_10d8 = CONCAT44(fStack_f74 + 0.16666666,fStack_f78 + 0.16666666);
      uStack_10d0 = CONCAT44(fStack_f6c + 0.16666666,fStack_f70 + 0.16666666);
      uStack_10c8 = CONCAT44(uStack_1308._4_4_ + 0.16666666,fStack_f68 + 0.16666666);
      local_1100 = local_13e0._0_8_;
      uStack_10f8 = local_13e0._8_8_;
      uStack_10f0 = local_13e0._16_8_;
      uStack_10e8 = local_13e0._24_8_;
      local_10c0 = local_13e0._0_8_;
      uStack_10b8 = local_13e0._8_8_;
      uStack_10b0 = local_13e0._16_8_;
      uStack_10a8 = local_13e0._24_8_;
      fStack_1044 = uStack_1308._4_4_;
      local_1060 = (local_f80 + 0.16666666) * (float)local_1320;
      fStack_105c = (fStack_f7c + 0.16666666) * local_1320._4_4_;
      fStack_1058 = (fStack_f78 + 0.16666666) * (float)uStack_1318;
      fStack_1054 = (fStack_f74 + 0.16666666) * uStack_1318._4_4_;
      fStack_1050 = (fStack_f70 + 0.16666666) * (float)uStack_1310;
      fStack_104c = (fStack_f6c + 0.16666666) * uStack_1310._4_4_;
      fStack_1048 = (fStack_f68 + 0.16666666) * (float)uStack_1308;
      local_1080 = 0x3f0000003f000000;
      uStack_1078 = 0x3f0000003f000000;
      uStack_1070 = 0x3f0000003f000000;
      uStack_1068 = 0x3f0000003f000000;
      local_1180 = CONCAT44(fStack_105c + 0.5,local_1060 + 0.5);
      auVar2._8_4_ = fStack_1058 + 0.5;
      auVar2._0_8_ = local_1180;
      auVar2._12_4_ = fStack_1054 + 0.5;
      auVar15._16_4_ = fStack_1050 + 0.5;
      auVar15._0_16_ = auVar2;
      auVar15._20_4_ = fStack_104c + 0.5;
      auVar14._24_4_ = fStack_1048 + 0.5;
      auVar14._0_24_ = auVar15;
      auVar14._28_4_ = uStack_1308._4_4_ + 0.5;
      local_11e0 = local_1400;
      uStack_11d8 = uStack_13f8;
      uStack_13f0 = auVar36._16_8_;
      uStack_11d0 = uStack_13f0;
      uStack_13e8 = auVar4._24_8_;
      uStack_11c8 = uStack_13e8;
      local_1200 = local_13e0._0_8_;
      uStack_11f8 = local_13e0._8_8_;
      uStack_11f0 = local_13e0._16_8_;
      uStack_11e8 = local_13e0._24_8_;
      local_11c0._8_8_ = auVar2._8_8_;
      uStack_1178 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar15._16_8_;
      uStack_1170 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar14._24_8_;
      uStack_1168 = local_11c0._24_8_;
      local_11a0 = local_1400;
      uStack_1198 = uStack_13f8;
      uStack_1190 = uStack_13f0;
      uStack_1188 = uStack_13e8;
      fStack_1124 = uStack_1308._4_4_;
      local_1140 = (local_1060 + 0.5) * (float)local_1320 * (float)local_1320;
      fStack_113c = (fStack_105c + 0.5) * local_1320._4_4_ * local_1320._4_4_;
      fStack_1138 = (fStack_1058 + 0.5) * (float)uStack_1318 * (float)uStack_1318;
      fStack_1134 = (fStack_1054 + 0.5) * uStack_1318._4_4_ * uStack_1318._4_4_;
      fStack_1130 = (fStack_1050 + 0.5) * (float)uStack_1310 * (float)uStack_1310;
      fStack_112c = (fStack_104c + 0.5) * uStack_1310._4_4_ * uStack_1310._4_4_;
      fStack_1128 = (fStack_1048 + 0.5) * (float)uStack_1308 * (float)uStack_1308;
      local_1160 = local_13e0._0_8_;
      uStack_1158 = local_13e0._8_8_;
      uStack_1150 = local_13e0._16_8_;
      uStack_1148 = local_13e0._24_8_;
      local_12e0 = CONCAT44(fStack_113c + local_1320._4_4_,local_1140 + (float)local_1320);
      uStack_12d8 = CONCAT44(fStack_1134 + uStack_1318._4_4_,fStack_1138 + (float)uStack_1318);
      uStack_12d0 = CONCAT44(fStack_112c + uStack_1310._4_4_,fStack_1130 + (float)uStack_1310);
      uStack_12c8 = CONCAT44(uStack_1308._4_4_ + uStack_1308._4_4_,fStack_1128 + (float)uStack_1308)
      ;
      local_1300 = 0x3f8000003f800000;
      uStack_12f8 = 0x3f8000003f800000;
      uStack_12f0 = 0x3f8000003f800000;
      uStack_12e8 = 0x3f8000003f800000;
      local_14a0 = local_1140 + (float)local_1320 + 1.0;
      fStack_149c = fStack_113c + local_1320._4_4_ + 1.0;
      fStack_1498 = fStack_1138 + (float)uStack_1318 + 1.0;
      fStack_1494 = fStack_1134 + uStack_1318._4_4_ + 1.0;
      fStack_1490 = fStack_1130 + (float)uStack_1310 + 1.0;
      fStack_148c = fStack_112c + uStack_1310._4_4_ + 1.0;
      fStack_1488 = fStack_1128 + (float)uStack_1308 + 1.0;
      fStack_1484 = uStack_1308._4_4_ + uStack_1308._4_4_ + 1.0;
      local_9e0 = local_1420;
      uStack_9d8 = uStack_1418;
      uStack_9d0 = uStack_1410;
      uStack_9c8 = uStack_1408;
      local_1440 = CONCAT44((int)local_a00._4_4_,(int)(float)local_a00);
      uStack_1438 = CONCAT44((int)uStack_9f8._4_4_,(int)(float)uStack_9f8);
      uStack_1430 = CONCAT44((int)uStack_9f0._4_4_,(int)(float)uStack_9f0);
      uStack_1428 = CONCAT44((int)uStack_9e8._4_4_,(int)(float)uStack_9e8);
      local_8e0 = local_1440;
      uStack_8d8 = uStack_1438;
      uStack_8d0 = uStack_1430;
      uStack_8c8 = uStack_1428;
      local_900 = 0x7f0000007f;
      uStack_8f8 = 0x7f0000007f;
      uStack_8f0 = 0x7f0000007f;
      uStack_8e8 = 0x7f0000007f;
      local_980 = local_1440;
      uStack_978 = uStack_1438;
      uStack_970 = uStack_1430;
      uStack_968 = uStack_1428;
      local_9a0 = 0x7f0000007f;
      uStack_998 = 0x7f0000007f;
      uStack_990 = 0x7f0000007f;
      uStack_988 = 0x7f0000007f;
      local_930 = 0x7f0000007f;
      uStack_928 = 0x7f0000007f;
      local_940 = 0x7f0000007f;
      uStack_938 = 0x7f0000007f;
      local_7a0 = local_1440;
      uStack_798 = uStack_1438;
      local_7b0 = 0x7f0000007f;
      uStack_7a8 = 0x7f0000007f;
      auVar22._8_8_ = uStack_1438;
      auVar22._0_8_ = local_1440;
      auVar21._8_8_ = 0x7f0000007f;
      auVar21._0_8_ = 0x7f0000007f;
      local_910 = vpaddd_avx(auVar22,auVar21);
      local_7c0 = uStack_1430;
      uStack_7b8 = uStack_1428;
      local_7d0 = 0x7f0000007f;
      uStack_7c8 = 0x7f0000007f;
      auVar3._8_8_ = uStack_1428;
      auVar3._0_8_ = uStack_1430;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_920 = vpaddd_avx(auVar3,auVar1);
      local_9c0 = local_910._0_8_;
      uStack_9b8 = local_910._8_8_;
      uStack_9b0 = local_920._0_8_;
      uStack_9a8 = local_920._8_8_;
      local_960 = local_910._0_8_;
      uStack_958 = local_910._8_8_;
      uStack_950 = local_920._0_8_;
      uStack_948 = local_920._8_8_;
      local_820 = local_910._0_8_;
      uStack_818 = local_910._8_8_;
      uStack_810 = local_920._0_8_;
      uStack_808 = local_920._8_8_;
      local_824 = 0x17;
      local_8a0 = local_910._0_8_;
      uStack_898 = local_910._8_8_;
      uStack_890 = local_920._0_8_;
      uStack_888 = local_920._8_8_;
      local_760 = local_910._0_8_;
      uStack_758 = local_910._8_8_;
      local_764 = 0x17;
      local_840 = vpslld_avx(local_910,ZEXT416(0x17));
      local_780 = local_920._0_8_;
      uStack_778 = local_920._8_8_;
      local_784 = 0x17;
      local_850 = vpslld_avx(local_920,ZEXT416(0x17));
      local_8c0 = local_840._0_8_;
      uStack_8b8 = local_840._8_8_;
      uStack_8b0 = local_850._0_8_;
      uStack_8a8 = local_850._8_8_;
      local_880 = local_840._0_8_;
      uStack_878 = local_840._8_8_;
      uStack_870 = local_850._0_8_;
      uStack_868 = local_850._8_8_;
      local_1440 = local_840._0_8_;
      uStack_1438 = local_840._8_8_;
      uStack_1430 = local_850._0_8_;
      uStack_1428 = local_850._8_8_;
      local_800 = local_840._0_8_;
      uStack_7f8 = local_840._8_8_;
      uStack_7f0 = local_850._0_8_;
      uStack_7e8 = local_850._8_8_;
      local_14c0 = local_840._0_8_;
      uStack_14b8 = local_840._8_8_;
      uStack_14b0 = local_850._0_8_;
      uStack_14a8 = local_850._8_8_;
      local_1360._4_4_ = fStack_149c;
      local_1360._0_4_ = local_14a0;
      local_1360._8_4_ = fStack_1498;
      local_1360._12_4_ = fStack_1494;
      local_1360._16_4_ = fStack_1490;
      local_1360._20_4_ = fStack_148c;
      local_1360._24_4_ = fStack_1488;
      local_1360._28_4_ = fStack_1484;
      local_1380._0_4_ = local_840._0_4_;
      local_1380._4_4_ = local_840._4_4_;
      uStack_1378._0_4_ = local_840._8_4_;
      uStack_1378._4_4_ = local_840._12_4_;
      uStack_1370._0_4_ = local_850._0_4_;
      uStack_1370._4_4_ = local_850._4_4_;
      uStack_1368._0_4_ = local_850._8_4_;
      local_14a0 = local_14a0 * (float)local_1380;
      fStack_149c = fStack_149c * local_1380._4_4_;
      fStack_1498 = fStack_1498 * (float)uStack_1378;
      fStack_1494 = fStack_1494 * uStack_1378._4_4_;
      fStack_1490 = fStack_1490 * (float)uStack_1370;
      fStack_148c = fStack_148c * uStack_1370._4_4_;
      fStack_1488 = fStack_1488 * (float)uStack_1368;
      local_1500 = CONCAT44(fStack_149c,local_14a0);
      uStack_14f8 = CONCAT44(fStack_1494,fStack_1498);
      uStack_14f0 = CONCAT44(fStack_148c,fStack_1490);
      uStack_14e8 = CONCAT44(fStack_1484,fStack_1488);
      local_14e0._0_4_ = local_1600._0_4_;
      local_14e0._4_4_ = local_1600._4_4_;
      fStack_14d8 = local_1600._8_4_;
      fStack_14d4 = local_1600._12_4_;
      fStack_14d0 = auStack_15f0._0_4_;
      fStack_14cc = auStack_15f0._4_4_;
      fStack_14c8 = auStack_15f0._8_4_;
      fStack_14c4 = auStack_15f0._12_4_;
      local_1540 = (float)local_14e0._0_4_ + local_14a0;
      fStack_153c = (float)local_14e0._4_4_ + fStack_149c;
      fStack_1538 = fStack_14d8 + fStack_1498;
      fStack_1534 = fStack_14d4 + fStack_1494;
      fStack_1530 = fStack_14d0 + fStack_1490;
      fStack_152c = fStack_14cc + fStack_148c;
      fStack_1528 = fStack_14c8 + fStack_1488;
      fStack_1524 = fStack_14c4 + fStack_1484;
      auVar5._4_4_ = fStack_153c;
      auVar5._0_4_ = local_1540;
      auVar5._8_4_ = fStack_1538;
      auVar5._12_4_ = fStack_1534;
      auVar5._16_4_ = fStack_1530;
      auVar5._20_4_ = fStack_152c;
      auVar5._24_4_ = fStack_1528;
      auVar5._28_4_ = fStack_1524;
      _local_1700 = vdivps_avx(local_1520,auVar5);
      local_1720 = local_1580._0_8_;
      uStack_1718 = local_1580._8_8_;
      uStack_1710 = auStack_1570._0_8_;
      uStack_1708 = auStack_1570._8_8_;
      local_1740._4_4_ = (float)local_1700._4_4_ * local_16e0._4_4_;
      local_1740._0_4_ = (float)local_1700._0_4_ * (float)local_16e0;
      local_1740._8_4_ = fStack_16f8 * (float)uStack_16d8;
      local_1740._12_4_ = fStack_16f4 * uStack_16d8._4_4_;
      local_1740._16_4_ = fStack_16f0 * (float)uStack_16d0;
      local_1740._20_4_ = fStack_16ec * uStack_16d0._4_4_;
      local_1740._24_4_ = fStack_16e8 * (float)uStack_16c8;
      local_1740._28_4_ = local_1700._28_4_;
      local_1760 = local_15c0._0_8_;
      uStack_1758 = local_15c0._8_8_;
      uStack_1750 = auStack_15b0._0_8_;
      uStack_1748 = auStack_15b0._8_8_;
      auVar6._16_8_ = auStack_15b0._0_8_;
      auVar6._0_16_ = local_15c0;
      auVar6._24_8_ = auStack_15b0._8_8_;
      auVar6 = vsubps_avx(local_1740,auVar6);
      local_1850 = local_1960;
      local_19e0 = auVar6._0_8_;
      local_1880 = local_19e0;
      uStack_19d8 = auVar6._8_8_;
      uStack_1878 = uStack_19d8;
      uStack_19d0 = auVar6._16_8_;
      uStack_1870 = uStack_19d0;
      uStack_19c8 = auVar6._24_8_;
      uStack_1868 = uStack_19c8;
      *local_1960 = auVar6;
      local_1960 = local_1960 + 1;
      local_16e0 = local_1580._0_8_;
      uStack_16d8 = local_1580._8_8_;
      uStack_16d0 = auStack_1570._0_8_;
      uStack_16c8 = auStack_1570._8_8_;
      local_16c0 = uVar7;
      uStack_16b8 = uVar8;
      uStack_16b0 = uVar9;
      uStack_16a8 = uStack_1888;
      local_15dc = local_15e0;
      local_15d8 = local_15e0;
      local_15d4 = local_15e0;
      local_15d0 = local_15e0;
      local_15cc = local_15e0;
      local_15c8 = local_15e0;
      local_15c4 = local_15e0;
      local_159c = local_15a0;
      local_1598 = local_15a0;
      local_1594 = local_15a0;
      local_1590 = local_15a0;
      local_158c = local_15a0;
      local_1588 = local_15a0;
      local_1584 = local_15a0;
      local_155c = local_1560;
      local_1558 = local_1560;
      local_1554 = local_1560;
      local_1550 = local_1560;
      local_154c = local_1560;
      local_1548 = local_1560;
      local_1544 = local_1560;
      _local_14e0 = local_1520;
      _local_1400 = auVar4;
      local_1380 = local_840._0_8_;
      uStack_1378 = local_840._8_8_;
      uStack_1370 = local_850._0_8_;
      uStack_1368 = local_850._8_8_;
      local_1320 = local_1340;
      uStack_1318 = uStack_1338;
      uStack_1310 = uStack_1330;
      uStack_1308 = uStack_1328;
      local_12a0 = local_12c0;
      local_11c0 = auVar14;
      local_10a0 = local_10e0;
      uStack_1098 = uStack_10d8;
      uStack_1090 = uStack_10d0;
      uStack_1088 = uStack_10c8;
      local_fc0 = local_1000;
      uStack_fb8 = uStack_ff8;
      uStack_fb0 = uStack_ff0;
      uStack_fa8 = uStack_fe8;
      local_ee0 = local_f20;
      uStack_ed8 = uStack_f18;
      uStack_ed0 = uStack_f10;
      uStack_ec8 = uStack_f08;
      local_e00 = local_e40;
      uStack_df8 = uStack_e38;
      uStack_df0 = uStack_e30;
      uStack_de8 = uStack_e28;
      local_d20 = local_d60;
      uStack_d18 = uStack_d58;
      uStack_d10 = uStack_d50;
      uStack_d08 = uStack_d48;
      local_cc0 = local_1120;
      uStack_cb8 = uStack_1118;
      uStack_cb0 = uStack_1110;
      uStack_ca8 = uStack_1108;
      local_c40 = uVar10;
      uStack_c38 = uVar11;
      uStack_c30 = uVar12;
      uStack_c28 = uVar13;
      local_a00 = local_1420;
      uStack_9f8 = uStack_1418;
      uStack_9f0 = uStack_1410;
      uStack_9e8 = uStack_1408;
    }
    for (; local_1798 = local_18f8, local_1988 = local_17f8, local_19b8 + 3 < local_1950;
        local_19b8 = local_19b8 + 4) {
      local_1848 = local_1960;
      local_1820 = *(undefined8 *)*local_1960;
      uStack_1818 = *(undefined8 *)(*local_1960 + 8);
      local_714 = 0x3f800000;
      local_730 = 0x3f800000;
      local_1830 = 0x3f8000003f800000;
      uStack_1828 = 0x3f8000003f800000;
      local_734 = 0x40000000;
      local_750 = 0x40000000;
      local_1840 = 0x4000000040000000;
      uStack_1838 = 0x4000000040000000;
      local_6c0._0_4_ = (float)local_1820;
      local_6c0._4_4_ = (float)((ulong)local_1820 >> 0x20);
      uStack_6b8._0_4_ = (float)uStack_1818;
      uStack_6b8._4_4_ = (float)((ulong)uStack_1818 >> 0x20);
      local_6a0 = (float)local_6c0 * 2.0;
      fStack_69c = local_6c0._4_4_ * 2.0;
      fStack_698 = (float)uStack_6b8 * 2.0;
      fStack_694 = uStack_6b8._4_4_ * 2.0;
      local_674 = 0x3f800000;
      local_690 = 0x3f800000;
      local_6b0 = 0x3f8000003f800000;
      uStack_6a8 = 0x3f8000003f800000;
      local_640._8_8_ = 0x3f8000003f800000;
      local_640._0_8_ = 0x3f8000003f800000;
      local_490 = ZEXT816(0) << 0x20;
      local_660 = 0;
      local_480._8_8_ = SUB168(ZEXT816(0),4);
      uStack_658 = local_480._8_8_;
      local_670 = CONCAT44(fStack_69c,local_6a0);
      uStack_668 = CONCAT44(fStack_694,fStack_698);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_480._8_8_;
      auVar24._8_8_ = uStack_668;
      auVar24._0_8_ = local_670;
      auVar2 = vsubps_avx(auVar35 << 0x40,auVar24);
      local_5e0 = 0x3f8000003f800000;
      uStack_5d8 = 0x3f8000003f800000;
      local_5a0._0_8_ = auVar2._0_8_;
      local_460 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar2._8_8_;
      uStack_458 = local_5a0._8_8_;
      local_470 = 0x42b0c0a542b0c0a5;
      uStack_468 = 0x42b0c0a542b0c0a5;
      auVar28._8_8_ = 0x42b0c0a542b0c0a5;
      auVar28._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar28);
      local_5a0._0_8_ = auVar2._0_8_;
      local_440 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar2._8_8_;
      uStack_438 = local_5a0._8_8_;
      local_450 = 0xc2b0c0a5c2b0c0a5;
      uStack_448 = 0xc2b0c0a5c2b0c0a5;
      auVar29._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar29);
      local_5a0._0_8_ = auVar3._0_8_;
      uVar7 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar3._8_8_;
      uVar8 = local_5a0._8_8_;
      local_4f0 = 0x3fb8aa3b3fb8aa3b;
      uStack_4e8 = 0x3fb8aa3b3fb8aa3b;
      local_4e0._0_4_ = auVar3._0_4_;
      local_4e0._4_4_ = auVar3._4_4_;
      uStack_4d8._0_4_ = auVar3._8_4_;
      uStack_4d8._4_4_ = auVar3._12_4_;
      local_5c0._4_4_ = local_4e0._4_4_ * 1.442695;
      local_5c0._0_4_ = (float)local_4e0 * 1.442695;
      uStack_5b8._0_4_ = (float)uStack_4d8 * 1.442695;
      uStack_5b8._4_4_ = uStack_4d8._4_4_ * 1.442695;
      local_4a0 = local_5c0;
      uStack_498 = uStack_5b8;
      local_4b0 = 0x3f0000003f000000;
      uStack_4a8 = 0x3f0000003f000000;
      local_5c0._0_4_ = (float)local_4e0 * 1.442695 + 0.5;
      local_5c0._4_4_ = local_4e0._4_4_ * 1.442695 + 0.5;
      fVar38 = (float)uStack_4d8 * 1.442695 + 0.5;
      fVar39 = uStack_4d8._4_4_ * 1.442695 + 0.5;
      uStack_5b8._0_4_ = fVar38;
      uStack_5b8._4_4_ = fVar39;
      local_420 = local_5c0;
      uStack_418 = uStack_5b8;
      local_5d0._4_4_ = (int)(float)local_5c0._4_4_;
      local_5d0._0_4_ = (int)(float)local_5c0._0_4_;
      local_5d0._8_4_ = (int)fVar38;
      local_5d0._12_4_ = (int)fVar39;
      local_410 = local_5d0._0_8_;
      uStack_408 = local_5d0._8_8_;
      auVar30._8_8_ = local_5d0._8_8_;
      auVar30._0_8_ = local_5d0._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar30);
      local_5b0 = auVar1._0_8_;
      local_3f0 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uStack_3e8 = uStack_5a8;
      local_400 = local_5c0;
      uStack_3f8 = uStack_5b8;
      auVar31._8_8_ = uStack_5b8;
      auVar31._0_8_ = local_5c0;
      auVar2 = vcmpps_avx(auVar31,auVar1,1);
      local_5f0._0_8_ = auVar2._0_8_;
      local_3d0 = local_5f0._0_8_;
      local_5f0._8_8_ = auVar2._8_8_;
      uStack_3c8 = local_5f0._8_8_;
      local_3e0 = 0x3f8000003f800000;
      uStack_3d8 = 0x3f8000003f800000;
      auVar32._8_8_ = 0x3f8000003f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      local_5f0 = vpand_avx(auVar2,auVar32);
      local_540 = local_5b0;
      uStack_538 = uStack_5a8;
      local_550 = local_5f0._0_8_;
      uStack_548 = local_5f0._8_8_;
      _local_5c0 = vsubps_avx(auVar1,local_5f0);
      local_330 = local_5c0;
      uStack_328 = uStack_5b8;
      local_350 = local_5a0._0_8_;
      uStack_348 = local_5a0._8_8_;
      local_340 = 0x3f3180003f318000;
      uStack_338 = 0x3f3180003f318000;
      local_310 = local_5a0._0_8_;
      uStack_308 = local_5a0._8_8_;
      local_300 = 0x3f3180003f318000;
      uStack_2f8 = 0x3f3180003f318000;
      local_2f0._0_4_ = local_5c0._0_4_;
      local_2f0._4_4_ = local_5c0._4_4_;
      uStack_2e8._0_4_ = local_5c0._8_4_;
      uStack_2e8._4_4_ = local_5c0._12_4_;
      local_320 = (float)local_2f0 * 0.6933594;
      fStack_31c = local_2f0._4_4_ * 0.6933594;
      fStack_318 = (float)uStack_2e8 * 0.6933594;
      fStack_314 = uStack_2e8._4_4_ * 0.6933594;
      auVar34._4_4_ = fStack_31c;
      auVar34._0_4_ = local_320;
      auVar34._8_4_ = fStack_318;
      auVar34._12_4_ = fStack_314;
      auVar2 = vsubps_avx(auVar3,auVar34);
      local_3a0 = local_5c0;
      uStack_398 = uStack_5b8;
      local_5a0._0_8_ = auVar2._0_8_;
      local_3c0 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar2._8_8_;
      uStack_3b8 = local_5a0._8_8_;
      local_3b0 = 0xb95e8083b95e8083;
      uStack_3a8 = 0xb95e8083b95e8083;
      local_380 = local_5a0._0_8_;
      uStack_378 = local_5a0._8_8_;
      local_360 = local_5c0;
      uStack_358 = uStack_5b8;
      local_370 = 0xb95e8083b95e8083;
      uStack_368 = 0xb95e8083b95e8083;
      local_390 = (float)local_2f0 * -0.00021219444;
      fStack_38c = local_2f0._4_4_ * -0.00021219444;
      fStack_388 = (float)uStack_2e8 * -0.00021219444;
      fStack_384 = uStack_2e8._4_4_ * -0.00021219444;
      auVar33._4_4_ = fStack_38c;
      auVar33._0_4_ = local_390;
      auVar33._8_4_ = fStack_388;
      auVar33._12_4_ = fStack_384;
      local_5a0 = vsubps_avx(auVar2,auVar33);
      local_510 = local_5a0._0_8_;
      uStack_508 = local_5a0._8_8_;
      local_500._0_4_ = local_5a0._0_4_;
      local_500._4_4_ = local_5a0._4_4_;
      uStack_4f8._0_4_ = local_5a0._8_4_;
      uStack_4f8._4_4_ = local_5a0._12_4_;
      local_5b0 = CONCAT44(local_500._4_4_ * local_500._4_4_,(float)local_500 * (float)local_500);
      uStack_5a8._0_4_ = (float)uStack_4f8 * (float)uStack_4f8;
      uStack_5a8._4_4_ = uStack_4f8._4_4_ * uStack_4f8._4_4_;
      local_90 = 0x3950696739506967;
      uStack_88 = 0x3950696739506967;
      local_a0 = local_5a0._0_8_;
      uStack_98 = local_5a0._8_8_;
      local_b0 = 0x3ab743ce3ab743ce;
      uStack_a8 = 0x3ab743ce3ab743ce;
      local_80 = local_5a0._0_8_;
      uStack_78 = local_5a0._8_8_;
      local_50 = (float)local_500 * 0.00019875691;
      fStack_4c = local_500._4_4_ * 0.00019875691;
      fStack_48 = (float)uStack_4f8 * 0.00019875691;
      fStack_44 = uStack_4f8._4_4_ * 0.00019875691;
      local_60 = 0x3ab743ce3ab743ce;
      uStack_58 = 0x3ab743ce3ab743ce;
      local_100 = CONCAT44(fStack_4c + 0.0013981999,local_50 + 0.0013981999);
      uStack_f8 = CONCAT44(fStack_44 + 0.0013981999,fStack_48 + 0.0013981999);
      local_110 = local_5a0._0_8_;
      uStack_108 = local_5a0._8_8_;
      local_120 = 0x3c0889083c088908;
      uStack_118 = 0x3c0889083c088908;
      local_f0 = local_5a0._0_8_;
      uStack_e8 = local_5a0._8_8_;
      local_c0 = (local_50 + 0.0013981999) * (float)local_500;
      fStack_bc = (fStack_4c + 0.0013981999) * local_500._4_4_;
      fStack_b8 = (fStack_48 + 0.0013981999) * (float)uStack_4f8;
      fStack_b4 = (fStack_44 + 0.0013981999) * uStack_4f8._4_4_;
      local_d0 = 0x3c0889083c088908;
      uStack_c8 = 0x3c0889083c088908;
      local_170 = CONCAT44(fStack_bc + 0.008333452,local_c0 + 0.008333452);
      uStack_168 = CONCAT44(fStack_b4 + 0.008333452,fStack_b8 + 0.008333452);
      local_180 = local_5a0._0_8_;
      uStack_178 = local_5a0._8_8_;
      local_190 = 0x3d2aa9c13d2aa9c1;
      uStack_188 = 0x3d2aa9c13d2aa9c1;
      local_160 = local_5a0._0_8_;
      uStack_158 = local_5a0._8_8_;
      local_130 = (local_c0 + 0.008333452) * (float)local_500;
      fStack_12c = (fStack_bc + 0.008333452) * local_500._4_4_;
      fStack_128 = (fStack_b8 + 0.008333452) * (float)uStack_4f8;
      fStack_124 = (fStack_b4 + 0.008333452) * uStack_4f8._4_4_;
      local_140 = 0x3d2aa9c13d2aa9c1;
      uStack_138 = 0x3d2aa9c13d2aa9c1;
      local_1e0 = CONCAT44(fStack_12c + 0.041665796,local_130 + 0.041665796);
      uStack_1d8 = CONCAT44(fStack_124 + 0.041665796,fStack_128 + 0.041665796);
      local_1f0 = local_5a0._0_8_;
      uStack_1e8 = local_5a0._8_8_;
      local_200 = 0x3e2aaaaa3e2aaaaa;
      uStack_1f8 = 0x3e2aaaaa3e2aaaaa;
      local_1d0 = local_5a0._0_8_;
      uStack_1c8 = local_5a0._8_8_;
      local_1a0 = (local_130 + 0.041665796) * (float)local_500;
      fStack_19c = (fStack_12c + 0.041665796) * local_500._4_4_;
      fStack_198 = (fStack_128 + 0.041665796) * (float)uStack_4f8;
      fStack_194 = (fStack_124 + 0.041665796) * uStack_4f8._4_4_;
      local_1b0 = 0x3e2aaaaa3e2aaaaa;
      uStack_1a8 = 0x3e2aaaaa3e2aaaaa;
      local_250 = CONCAT44(fStack_19c + 0.16666666,local_1a0 + 0.16666666);
      uStack_248 = CONCAT44(fStack_194 + 0.16666666,fStack_198 + 0.16666666);
      local_260 = local_5a0._0_8_;
      uStack_258 = local_5a0._8_8_;
      local_240 = local_5a0._0_8_;
      uStack_238 = local_5a0._8_8_;
      local_210 = (local_1a0 + 0.16666666) * (float)local_500;
      fStack_20c = (fStack_19c + 0.16666666) * local_500._4_4_;
      fStack_208 = (fStack_198 + 0.16666666) * (float)uStack_4f8;
      fStack_204 = (fStack_194 + 0.16666666) * uStack_4f8._4_4_;
      local_220 = 0x3f0000003f000000;
      uStack_218 = 0x3f0000003f000000;
      local_2a0 = CONCAT44(fStack_20c + 0.5,local_210 + 0.5);
      local_2c0._8_4_ = fStack_208 + 0.5;
      local_2c0._0_8_ = local_2a0;
      local_2c0._12_4_ = fStack_204 + 0.5;
      local_2d0 = local_5b0;
      uStack_2c8 = uStack_5a8;
      local_2e0 = local_5a0._0_8_;
      uStack_2d8 = local_5a0._8_8_;
      uStack_298 = local_2c0._8_8_;
      local_2b0 = local_5b0;
      uStack_2a8 = uStack_5a8;
      local_280 = (local_210 + 0.5) * (float)local_500 * (float)local_500;
      fStack_27c = (fStack_20c + 0.5) * local_500._4_4_ * local_500._4_4_;
      fStack_278 = (fStack_208 + 0.5) * (float)uStack_4f8 * (float)uStack_4f8;
      fStack_274 = (fStack_204 + 0.5) * uStack_4f8._4_4_ * uStack_4f8._4_4_;
      local_290 = local_5a0._0_8_;
      uStack_288 = local_5a0._8_8_;
      local_4c0 = CONCAT44(fStack_27c + local_500._4_4_,local_280 + (float)local_500);
      uStack_4b8 = CONCAT44(fStack_274 + uStack_4f8._4_4_,fStack_278 + (float)uStack_4f8);
      local_4d0 = 0x3f8000003f800000;
      uStack_4c8 = 0x3f8000003f800000;
      local_600 = local_280 + (float)local_500 + 1.0;
      fStack_5fc = fStack_27c + local_500._4_4_ + 1.0;
      fStack_5f8 = fStack_278 + (float)uStack_4f8 + 1.0;
      fStack_5f4 = fStack_274 + uStack_4f8._4_4_ + 1.0;
      local_430 = local_5c0;
      uStack_428 = uStack_5b8;
      local_5d0._4_4_ = (int)local_2f0._4_4_;
      local_5d0._0_4_ = (int)(float)local_2f0;
      local_5d0._8_4_ = (int)(float)uStack_2e8;
      local_5d0._12_4_ = (int)uStack_2e8._4_4_;
      local_580 = local_5d0._0_8_;
      uStack_578 = local_5d0._8_8_;
      local_590 = 0x7f0000007f;
      uStack_588 = 0x7f0000007f;
      auVar27._8_8_ = local_5d0._8_8_;
      auVar27._0_8_ = local_5d0._0_8_;
      auVar26._8_8_ = 0x7f0000007f;
      auVar26._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar27,auVar26);
      local_5d0._0_8_ = auVar2._0_8_;
      local_560 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar2._8_8_;
      uStack_558 = local_5d0._8_8_;
      local_564 = 0x17;
      local_5d0 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_40 = local_5d0._0_8_;
      uStack_38 = local_5d0._8_8_;
      local_610 = local_5d0._0_8_;
      uStack_608 = local_5d0._8_8_;
      local_520._4_4_ = fStack_5fc;
      local_520._0_4_ = local_600;
      local_520._8_4_ = fStack_5f8;
      local_520._12_4_ = fStack_5f4;
      local_530._0_4_ = local_5d0._0_4_;
      local_530._4_4_ = local_5d0._4_4_;
      uStack_528._0_4_ = local_5d0._8_4_;
      uStack_528._4_4_ = local_5d0._12_4_;
      local_600 = local_600 * (float)local_530;
      fStack_5fc = fStack_5fc * local_530._4_4_;
      fStack_5f8 = fStack_5f8 * (float)uStack_528;
      fStack_5f4 = fStack_5f4 * uStack_528._4_4_;
      local_630 = CONCAT44(fStack_5fc,local_600);
      uStack_628 = CONCAT44(fStack_5f4,fStack_5f8);
      local_650 = local_600 + 1.0;
      fStack_64c = fStack_5fc + 1.0;
      fStack_648 = fStack_5f8 + 1.0;
      fStack_644 = fStack_5f4 + 1.0;
      auVar25._4_4_ = fStack_64c;
      auVar25._0_4_ = local_650;
      auVar25._8_4_ = fStack_648;
      auVar25._12_4_ = fStack_644;
      _local_6e0 = vdivps_avx(local_640,auVar25);
      local_700._0_4_ = (float)local_6e0._0_4_ * 2.0;
      local_700._4_4_ = (float)local_6e0._4_4_ * 2.0;
      local_700._8_4_ = fStack_6d8 * 2.0;
      local_700._12_4_ = fStack_6d4 * 2.0;
      auVar23._8_8_ = 0x3f8000003f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(local_700,auVar23);
      local_1800 = local_1960;
      local_19f0 = auVar2._0_8_;
      local_1810 = local_19f0;
      uStack_19e8 = auVar2._8_8_;
      uStack_1808 = uStack_19e8;
      *(undefined1 (*) [16])*local_1960 = auVar2;
      local_1960 = (undefined1 (*) [32])(*local_1960 + 0x10);
      uStack_74c = local_750;
      uStack_748 = local_750;
      uStack_744 = local_750;
      uStack_72c = local_730;
      uStack_728 = local_730;
      uStack_724 = local_730;
      local_710 = local_1830;
      uStack_708 = uStack_1828;
      local_6f0 = local_1840;
      uStack_6e8 = uStack_1838;
      local_6d0 = local_1840;
      uStack_6c8 = uStack_1838;
      local_6c0 = local_1820;
      uStack_6b8 = uStack_1818;
      uStack_68c = local_690;
      uStack_688 = local_690;
      uStack_684 = local_690;
      local_620 = local_640;
      local_530 = local_5d0._0_8_;
      uStack_528 = local_5d0._8_8_;
      local_500 = local_510;
      uStack_4f8 = uStack_508;
      local_4e0 = uVar7;
      uStack_4d8 = uVar8;
      local_480 = local_490;
      local_2f0 = local_5c0;
      uStack_2e8 = uStack_5b8;
      local_270 = local_4b0;
      uStack_268 = uStack_4a8;
      local_230 = local_250;
      uStack_228 = uStack_248;
      local_1c0 = local_1e0;
      uStack_1b8 = uStack_1d8;
      local_150 = local_170;
      uStack_148 = uStack_168;
      local_e0 = local_100;
      uStack_d8 = uStack_f8;
      local_70 = local_90;
      uStack_68 = uStack_88;
    }
    for (; local_19b8 < local_1950; local_19b8 = local_19b8 + 1) {
      dVar37 = std::tanh((double)(ulong)*(uint *)*local_1960);
      *(int *)*local_1960 = SUB84(dVar37,0);
      local_1960 = (undefined1 (*) [32])(*local_1960 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}